

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::directiveList(GrpParser *this)

{
  int iVar1;
  undefined8 uVar2;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp24_AST;
  RefAST tmp23_AST;
  RefAST tmp22_AST;
  RefAST tmp21_AST;
  RefAST directiveList_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffed0;
  RefCount<AST> *in_stack_fffffffffffffed8;
  ASTPair *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  RefCount<AST> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  Parser *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  ASTFactory *this_00;
  undefined1 local_c0 [8];
  RefToken *in_stack_ffffffffffffff48;
  NoViableAltException *in_stack_ffffffffffffff50;
  undefined1 local_a0 [15];
  undefined1 local_91;
  GrpParser *in_stack_ffffffffffffff70;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=
            (in_stack_fffffffffffffef0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  ASTPair::ASTPair(in_stack_fffffffffffffee0);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffee0->root,in_stack_fffffffffffffed8);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffee0->root,in_stack_fffffffffffffed8);
  this_00 = (ASTFactory *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (RefToken *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  RefCount<AST>::operator=
            (in_stack_fffffffffffffef0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffee0);
  Parser::match(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar1 != 0xc) {
    if (iVar1 != 0xd) {
      uVar2 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_a0,in_RDI,1);
      NoViableAltException::NoViableAltException
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      __cxa_throw(uVar2,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    directive(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff10 = (Parser *)(in_RDI + 6);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffee0->root,in_stack_fffffffffffffed8);
    ASTFactory::addASTChild
              (this_00,(ASTPair *)CONCAT44(iVar1,in_stack_ffffffffffffff18),
               (RefAST *)in_stack_ffffffffffffff10);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    while (((in_stack_ffffffffffffff0c = (**(code **)(*in_RDI + 0x20))(in_RDI,1),
            in_stack_ffffffffffffff0c == 8 &&
            (in_stack_ffffffffffffff08 = (**(code **)(*in_RDI + 0x20))(in_RDI,2),
            in_stack_ffffffffffffff08 == 0xd)) &&
           (in_stack_ffffffffffffff04 = (**(code **)(*in_RDI + 0x20))(in_RDI,3),
           in_stack_ffffffffffffff04 == 4))) {
      RefCount<AST>::RefCount(&in_stack_fffffffffffffee0->root,in_stack_fffffffffffffed8);
      (**(code **)(*in_RDI + 0x28))(local_68,in_RDI,1);
      ASTFactory::create((ASTFactory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                         ,(RefToken *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
      ;
      RefCount<AST>::operator=
                (in_stack_fffffffffffffef0,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffee0);
      Parser::match(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      directive(in_stack_ffffffffffffff70);
      in_stack_fffffffffffffef0 = (RefCount<AST> *)(in_RDI + 6);
      RefCount<AST>::RefCount(&in_stack_fffffffffffffee0->root,in_stack_fffffffffffffed8);
      ASTFactory::addASTChild
                (this_00,(ASTPair *)CONCAT44(iVar1,in_stack_ffffffffffffff18),
                 (RefAST *)in_stack_ffffffffffffff10);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    }
    in_stack_fffffffffffffeec = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if (in_stack_fffffffffffffeec == 8) {
      RefCount<AST>::RefCount(&in_stack_fffffffffffffee0->root,in_stack_fffffffffffffed8);
      in_stack_fffffffffffffee0 = (ASTPair *)(in_RDI + 6);
      (**(code **)(*in_RDI + 0x28))(local_88,in_RDI,1);
      ASTFactory::create((ASTFactory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                         ,(RefToken *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
      ;
      RefCount<AST>::operator=
                (in_stack_fffffffffffffef0,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffee0);
      Parser::match(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
    }
    else if (in_stack_fffffffffffffeec != 0xc) {
      local_91 = 1;
      uVar2 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff70,in_RDI,1);
      NoViableAltException::NoViableAltException
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_91 = 0;
      __cxa_throw(uVar2,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffee0->root,in_stack_fffffffffffffed8);
  (**(code **)(*in_RDI + 0x28))(local_c0,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (RefToken *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  RefCount<AST>::operator=
            (in_stack_fffffffffffffef0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffee0);
  Parser::match(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  RefCount<AST>::operator=
            (in_stack_fffffffffffffef0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
  RefCount<AST>::operator=
            (in_stack_fffffffffffffef0,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffed0->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void GrpParser::directiveList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST directiveList_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp21_AST = nullAST;
		tmp21_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		{
			directive();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((LA(1)==OP_SEMI) && (LA(2)==IDENT) && (LA(3)==OP_EQ)) {
					RefAST tmp22_AST = nullAST;
					tmp22_AST = astFactory.create(LT(1));
					match(OP_SEMI);
					directive();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop20;
				}
				
			} while (true);
			_loop20:;
			}
			{
			switch ( LA(1)) {
			case OP_SEMI:
			{
				RefAST tmp23_AST = nullAST;
				tmp23_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				break;
			}
			case OP_RBRACE:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp24_AST = nullAST;
		tmp24_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		directiveList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_9);
	}
	returnAST = directiveList_AST;
}